

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ExpressionOrDistSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionOrDistSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::DistConstraintListSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,DistConstraintListSyntax *args_1)

{
  ExpressionOrDistSyntax *pEVar1;
  
  pEVar1 = (ExpressionOrDistSyntax *)allocate(this,0x28,8);
  (pEVar1->super_ExpressionSyntax).super_SyntaxNode.kind = ExpressionOrDist;
  (pEVar1->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar1->super_ExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pEVar1->expr).ptr = args;
  (pEVar1->distribution).ptr = args_1;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pEVar1;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pEVar1;
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }